

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O1

Mesh * vera::icosphereMesh(Mesh *__return_storage_ptr__,float _radius,size_t _iterations)

{
  vec<3,_float,_(glm::qualifier)0> *pvVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar6;
  pointer pvVar7;
  pointer pvVar8;
  pointer puVar9;
  pointer puVar10;
  pointer puVar11;
  Mesh *this;
  ulong uVar12;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar17;
  ulong uVar18;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar19;
  long lVar20;
  long lVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  initializer_list<unsigned_int> __l;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vertices;
  vector<int,_std::allocator<int>_> indexToSplit;
  uint32_t i1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  uint32_t i2;
  uint32_t i3;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texCoords;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_248;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_228;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_224;
  vec<2,_float,_(glm::qualifier)0> vStack_220;
  vec<2,_float,_(glm::qualifier)0> local_218;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_208 [2];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_200;
  float local_1fc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_1e0 [2];
  float local_1d8;
  float local_1d4;
  float local_1d0;
  uint local_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  iterator iStack_1b0;
  pointer local_1a8;
  undefined1 local_c8 [16];
  ulong local_b8;
  float local_b0;
  float local_ac;
  undefined1 local_a8 [16];
  size_t local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  Mesh *local_68;
  size_t local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_248.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  local_248.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  local_248.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  local_1b8 = (undefined1  [8])0x3f59c440bf069650;
  iStack_1b0._M_current = iStack_1b0._M_current & 0xffffffff00000000;
  local_b0 = _radius;
  local_90 = _iterations;
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  _M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&local_248,(iterator)0x0,(vec<3,_float,_(glm::qualifier)0> *)local_1b8);
  local_1b8 = (undefined1  [8])0x3f59c4403f069650;
  iStack_1b0._M_current = iStack_1b0._M_current & 0xffffffff00000000;
  if (local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_248,
               (iterator)
               local_248.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vec<3,_float,_(glm::qualifier)0> *)local_1b8);
  }
  else {
    ((local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = 0.0;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f069650;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f59c440;
    local_248.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_1b8 = (undefined1  [8])0x3f06965000000000;
  iStack_1b0._M_current._0_4_ = -0.8506508;
  if (local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_248,
               (iterator)
               local_248.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vec<3,_float,_(glm::qualifier)0> *)local_1b8);
  }
  else {
    ((local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = -0.8506508;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f069650;
    local_248.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_1b8 = (undefined1  [8])0x3f06965000000000;
  iStack_1b0._M_current._0_4_ = 0.8506508;
  if (local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_248,
               (iterator)
               local_248.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vec<3,_float,_(glm::qualifier)0> *)local_1b8);
  }
  else {
    ((local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = 0.8506508;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f069650;
    local_248.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_1b8 = (undefined1  [8])0xbf59c440;
  iStack_1b0._M_current._0_4_ = -0.5257311;
  if (local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_248,
               (iterator)
               local_248.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vec<3,_float,_(glm::qualifier)0> *)local_1b8);
  }
  else {
    ((local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = -0.5257311;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf59c440;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    local_248.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_1b8 = (undefined1  [8])0xbf59c440;
  iStack_1b0._M_current._0_4_ = 0.5257311;
  if (local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_248,
               (iterator)
               local_248.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vec<3,_float,_(glm::qualifier)0> *)local_1b8);
  }
  else {
    ((local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = 0.5257311;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf59c440;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    local_248.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_1b8 = (undefined1  [8])0x3f59c440;
  iStack_1b0._M_current._0_4_ = -0.5257311;
  if (local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_248,
               (iterator)
               local_248.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vec<3,_float,_(glm::qualifier)0> *)local_1b8);
  }
  else {
    ((local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = -0.5257311;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f59c440;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    local_248.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_1b8 = (undefined1  [8])0x3f59c440;
  iStack_1b0._M_current._0_4_ = 0.5257311;
  if (local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_248,
               (iterator)
               local_248.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vec<3,_float,_(glm::qualifier)0> *)local_1b8);
  }
  else {
    ((local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = 0.5257311;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f59c440;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    local_248.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_1b8 = (undefined1  [8])0xbf06965000000000;
  iStack_1b0._M_current._0_4_ = -0.8506508;
  if (local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_248,
               (iterator)
               local_248.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vec<3,_float,_(glm::qualifier)0> *)local_1b8);
  }
  else {
    ((local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = -0.8506508;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf069650;
    local_248.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_1b8 = (undefined1  [8])0xbf06965000000000;
  iStack_1b0._M_current._0_4_ = 0.8506508;
  if (local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_248,
               (iterator)
               local_248.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vec<3,_float,_(glm::qualifier)0> *)local_1b8);
  }
  else {
    ((local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = 0.8506508;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf069650;
    local_248.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_1b8 = (undefined1  [8])0xbf59c440bf069650;
  iStack_1b0._M_current._0_4_ = 0.0;
  if (local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_248,
               (iterator)
               local_248.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vec<3,_float,_(glm::qualifier)0> *)local_1b8);
  }
  else {
    ((local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = 0.0;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf069650;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf59c440;
    local_248.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_1b8 = (undefined1  [8])0xbf59c4403f069650;
  iStack_1b0._M_current =
       (vec<2,_float,_(glm::qualifier)0> *)((ulong)iStack_1b0._M_current._4_4_ << 0x20);
  if (local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_248,
               (iterator)
               local_248.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vec<3,_float,_(glm::qualifier)0> *)local_1b8);
  }
  else {
    ((local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = 0.0;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f069650;
    (local_248.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf59c440;
    local_248.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_68 = __return_storage_ptr__;
  memcpy(local_1b8,&DAT_002f4c10,0xf0);
  __l._M_len = 0x3c;
  __l._M_array = (iterator)local_1b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1f8,__l,(allocator_type *)&local_228);
  if (local_90 != 0) {
    local_b8 = (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2;
    sVar14 = 0;
    do {
      local_b8 = local_b8 << 2;
      local_1b8 = (undefined1  [8])0x0;
      iStack_1b0._M_current = (pointer)0x0;
      local_1a8 = (pointer)0x0;
      local_60 = sVar14;
      if (0xb < local_b8) {
        lVar20 = local_b8 / 0xc + (ulong)(local_b8 / 0xc == 0);
        lVar21 = 8;
        do {
          pvVar8 = local_248.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pvVar7 = local_248.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          aVar17 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                    ((long)&((pointer)
                            ((long)local_1f8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + -8))->field_0 + lVar21
                    );
          local_208[0] = aVar17;
          aVar13 = *(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)
                    ((long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar21 + -4);
          local_1e0[0] = aVar13;
          local_1cc = *(uint *)((long)(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3
                                       *)local_1f8.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar21);
          local_1fc = local_248.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(uint)aVar17].field_2.z;
          local_1d8 = local_248.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_1cc].field_0.x;
          local_1d4 = local_248.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_1cc].field_1.y;
          local_1d0 = local_248.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_1cc].field_2.z;
          local_78 = ZEXT416((uint)local_248.
                                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(uint)aVar17].field_0.x
                            );
          local_1c8 = ZEXT416((uint)local_248.
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(uint)aVar13].field_0.
                                    x);
          fVar24 = local_248.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(uint)aVar17].field_0.x +
                   local_248.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(uint)aVar13].field_0.x;
          local_88 = ZEXT416((uint)local_248.
                                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(uint)aVar17].field_1.y
                            );
          local_a8 = ZEXT416((uint)local_248.
                                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(uint)aVar13].field_1.y
                            );
          fVar25 = local_248.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(uint)aVar17].field_1.y +
                   local_248.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(uint)aVar13].field_1.y;
          local_c8._0_4_ =
               local_248.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(uint)aVar13].field_2.z;
          fVar23 = local_1fc +
                   local_248.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(uint)aVar13].field_2.z;
          fVar22 = fVar23 * fVar23 + fVar25 * fVar25 + fVar24 * fVar24;
          if (fVar22 < 0.0) {
            local_48 = ZEXT416((uint)fVar24);
            local_58 = ZEXT416((uint)fVar25);
            local_ac = fVar23;
            fVar22 = sqrtf(fVar22);
            fVar23 = local_ac;
            fVar24 = (float)local_48._0_4_;
            fVar25 = (float)local_58._0_4_;
          }
          else {
            fVar22 = SQRT(fVar22);
          }
          fVar22 = 1.0 / fVar22;
          aStack_224.y = fVar25 * fVar22;
          local_228.x = fVar24 * fVar22;
          vStack_220.field_0.x = fVar23 * fVar22;
          if (local_248.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_248.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)&local_248,
                       (iterator)
                       local_248.
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (vec<3,_float,_(glm::qualifier)0> *)&local_228);
          }
          else {
            ((local_248.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = fVar23 * fVar22;
            (local_248.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(fVar24 * fVar22);
            (local_248.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(fVar25 * fVar22);
            local_248.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_248.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_1c8._0_4_ = (float)local_1c8._0_4_ + local_1d8;
          local_a8._0_4_ = (float)local_a8._0_4_ + local_1d4;
          fVar23 = (float)local_c8._0_4_ + local_1d0;
          local_c8._0_4_ = fVar23;
          fVar23 = fVar23 * fVar23 +
                   (float)local_a8._0_4_ * (float)local_a8._0_4_ +
                   (float)local_1c8._0_4_ * (float)local_1c8._0_4_;
          if (fVar23 < 0.0) {
            fVar23 = sqrtf(fVar23);
          }
          else {
            fVar23 = SQRT(fVar23);
          }
          fVar23 = 1.0 / fVar23;
          aStack_224.y = (float)local_a8._0_4_ * fVar23;
          local_228.x = (float)local_1c8._0_4_ * fVar23;
          vStack_220.field_0.x = (float)local_c8._0_4_ * fVar23;
          if (local_248.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_248.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)&local_248,
                       (iterator)
                       local_248.
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (vec<3,_float,_(glm::qualifier)0> *)&local_228);
          }
          else {
            ((local_248.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->field_2).z =
                 (float)local_c8._0_4_ * fVar23;
            (local_248.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                 ((float)local_1c8._0_4_ * fVar23);
            (local_248.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
                 ((float)local_a8._0_4_ * fVar23);
            local_248.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_248.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_78._0_4_ = (float)local_78._0_4_ + local_1d8;
          local_88._0_4_ = (float)local_88._0_4_ + local_1d4;
          local_1fc = local_1fc + local_1d0;
          fVar23 = local_1fc * local_1fc +
                   (float)local_88._0_4_ * (float)local_88._0_4_ +
                   (float)local_78._0_4_ * (float)local_78._0_4_;
          if (fVar23 < 0.0) {
            fVar23 = sqrtf(fVar23);
          }
          else {
            fVar23 = SQRT(fVar23);
          }
          fVar23 = 1.0 / fVar23;
          aStack_224.y = (float)local_88._0_4_ * fVar23;
          local_228.x = (float)local_78._0_4_ * fVar23;
          vStack_220.field_0.x = local_1fc * fVar23;
          if (local_248.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_248.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)&local_248,
                       (iterator)
                       local_248.
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (vec<3,_float,_(glm::qualifier)0> *)&local_228);
          }
          else {
            ((local_248.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = local_1fc * fVar23;
            (local_248.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                 ((float)local_78._0_4_ * fVar23);
            (local_248.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
                 ((float)local_88._0_4_ * fVar23);
            local_248.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_248.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if (iStack_1b0._M_current == local_1a8) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_1b8,
                       (iterator)iStack_1b0._M_current,(uint *)local_208);
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)iStack_1b0._M_current
                 = local_208[0];
            iStack_1b0._M_current = iStack_1b0._M_current + 4;
          }
          aVar17 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                   ((int)((long)pvVar8 - (long)pvVar7 >> 2) * -0x55555555);
          if (iStack_1b0._M_current == local_1a8) {
            local_228 = aVar17;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,
                       (iterator)iStack_1b0._M_current,(uint *)&local_228);
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)iStack_1b0._M_current
                 = aVar17;
            iStack_1b0._M_current = iStack_1b0._M_current + 4;
          }
          aVar13 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)((int)aVar17 + 2)
          ;
          local_228 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)aVar13;
          if (iStack_1b0._M_current == local_1a8) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,
                       (iterator)iStack_1b0._M_current,(uint *)&local_228);
          }
          else {
            (iStack_1b0._M_current)->field_0 = aVar13;
            iStack_1b0._M_current = iStack_1b0._M_current + 4;
          }
          if (iStack_1b0._M_current == local_1a8) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_1b8,
                       (iterator)iStack_1b0._M_current,(uint *)local_1e0);
          }
          else {
            (iStack_1b0._M_current)->field_0 = local_1e0[0];
            iStack_1b0._M_current = iStack_1b0._M_current + 4;
          }
          aVar19 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)((int)aVar17 + 1)
          ;
          if (iStack_1b0._M_current == local_1a8) {
            local_228 = aVar19;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,
                       (iterator)iStack_1b0._M_current,(uint *)&local_228);
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)iStack_1b0._M_current
                 = aVar19;
            iStack_1b0._M_current = iStack_1b0._M_current + 4;
          }
          local_228 = aVar17;
          if (iStack_1b0._M_current == local_1a8) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,
                       (iterator)iStack_1b0._M_current,(uint *)&local_228);
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)iStack_1b0._M_current
                 = aVar17;
            iStack_1b0._M_current = iStack_1b0._M_current + 4;
          }
          if (iStack_1b0._M_current == local_1a8) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_1b8,
                       (iterator)iStack_1b0._M_current,&local_1cc);
          }
          else {
            *(uint *)iStack_1b0._M_current = local_1cc;
            iStack_1b0._M_current = iStack_1b0._M_current + 4;
          }
          if (iStack_1b0._M_current == local_1a8) {
            local_228 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)aVar13;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,
                       (iterator)iStack_1b0._M_current,(uint *)&local_228);
          }
          else {
            (iStack_1b0._M_current)->field_0 = aVar13;
            iStack_1b0._M_current = iStack_1b0._M_current + 4;
          }
          if (iStack_1b0._M_current == local_1a8) {
            local_228 = aVar19;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,
                       (iterator)iStack_1b0._M_current,(uint *)&local_228);
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)iStack_1b0._M_current
                 = aVar19;
            iStack_1b0._M_current = iStack_1b0._M_current + 4;
          }
          if (iStack_1b0._M_current == local_1a8) {
            local_228 = aVar17;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,
                       (iterator)iStack_1b0._M_current,(uint *)&local_228);
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)iStack_1b0._M_current
                 = aVar17;
            iStack_1b0._M_current = iStack_1b0._M_current + 4;
          }
          if (iStack_1b0._M_current == local_1a8) {
            local_228 = aVar19;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,
                       (iterator)iStack_1b0._M_current,(uint *)&local_228);
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)iStack_1b0._M_current
                 = aVar19;
            iStack_1b0._M_current = iStack_1b0._M_current + 4;
          }
          local_228 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)aVar13;
          if (iStack_1b0._M_current == local_1a8) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,
                       (iterator)iStack_1b0._M_current,(uint *)&local_228);
          }
          else {
            (iStack_1b0._M_current)->field_0 = aVar13;
            iStack_1b0._M_current = iStack_1b0._M_current + 4;
          }
          lVar21 = lVar21 + 0xc;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
      sVar14 = local_60;
      puVar11 = local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      puVar10 = local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      puVar9 = local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1b8;
      local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)iStack_1b0._M_current;
      local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1a8;
      local_1b8 = (undefined1  [8])puVar9;
      iStack_1b0._M_current = (vec<2,_float,_(glm::qualifier)0> *)puVar10;
      local_1a8 = (pointer)puVar11;
      if ((pointer)puVar9 != (pointer)0x0) {
        operator_delete(puVar9);
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 != local_90);
  }
  local_1b8 = (undefined1  [8])0x0;
  iStack_1b0._M_current = (vec<2,_float,_(glm::qualifier)0> *)0x0;
  local_1a8 = (vec<2,_float,_(glm::qualifier)0> *)0x0;
  if (local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar20 = 8;
    uVar18 = 0;
    do {
      pvVar7 = local_248.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      fVar23 = *(float *)((long)local_248.
                                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8);
      fVar24 = *(float *)((long)&(local_248.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar20);
      fVar23 = fVar23 * fVar23 + fVar24 * fVar24;
      if (fVar23 < 0.0) {
        fVar23 = sqrtf(fVar23);
      }
      else {
        fVar23 = SQRT(fVar23);
      }
      local_1c8._0_4_ = fVar23;
      fVar23 = atan2f(*(float *)((long)&pvVar7->field_0 + lVar20),
                      *(float *)((long)pvVar7 + lVar20 + -8));
      local_c8._0_4_ = fVar23 / 6.2831855 + 0.5;
      fVar23 = atan2f(*(float *)((long)pvVar7 + lVar20 + -4),(float)local_1c8._0_4_);
      aStack_224.y = 1.0 - (fVar23 / 3.1415927 + 0.5);
      local_228.x = 1.0 - (float)local_c8._0_4_;
      if (iStack_1b0._M_current == local_1a8) {
        std::
        vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
        ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>>
                  ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                    *)local_1b8,iStack_1b0,(vec<2,_float,_(glm::qualifier)0> *)&local_228);
      }
      else {
        *iStack_1b0._M_current = _local_228;
        iStack_1b0._M_current = iStack_1b0._M_current + 1;
      }
      uVar18 = uVar18 + 1;
      lVar20 = lVar20 + 0xc;
    } while (uVar18 < (ulong)(((long)local_248.
                                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_248.
                                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x5555555555555555));
  }
  local_228 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  aStack_224 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  vStack_220.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  vStack_220.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  local_218.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_218.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  if (8 < (ulong)((long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start)) {
    lVar20 = 0;
    uVar18 = 0;
    do {
      fVar23 = (((pointer)
                ((long)local_1b8 +
                (ulong)*(uint *)((long)(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3
                                        *)local_1f8.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar20) * 8))
               ->field_0).x;
      local_1c8._0_4_ =
           ((pointer)
           ((long)local_1b8 +
           (ulong)*(uint *)((long)((long)local_1f8.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4) + lVar20) *
           8))->field_0;
      local_c8 = ZEXT416((uint)(((pointer)
                                ((long)local_1b8 +
                                (ulong)*(uint *)((long)&((pointer)
                                                        ((long)local_1f8.
                                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 8))->
                                                  field_0 + lVar20) * 8))->field_0).x);
      if (0.5 < ABS((((pointer)
                     ((long)local_1b8 +
                     (ulong)*(uint *)((long)&((pointer)
                                             ((long)local_1f8.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 8))->
                                             field_0 + lVar20) * 8))->field_0).x - fVar23)) {
        local_a8._0_4_ = fVar23;
        if (0.5 <= fVar23) {
          aVar17 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                    ((long)&((pointer)
                            ((long)local_1f8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + 8))->field_0 + lVar20)
          ;
          local_208[0] = aVar17;
          if (vStack_220 != local_218) goto LAB_0021dd30;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&local_228,(iterator)vStack_220,
                     (int *)local_208);
        }
        else {
          aVar17 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                    ((long)(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)
                           local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar20);
          local_208[0] = aVar17;
          if (vStack_220 == local_218) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)&local_228,(iterator)vStack_220,
                       (int *)local_208);
          }
          else {
LAB_0021dd30:
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)vStack_220 = aVar17;
            vStack_220 = (vec<2,_float,_(glm::qualifier)0>)((long)vStack_220 + 4);
          }
        }
        fVar23 = (float)local_a8._0_4_;
      }
      if (0.5 < ABS((float)local_1c8._0_4_ - fVar23)) {
        if (0.5 <= fVar23) {
          aVar17 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                    ((long)((long)local_1f8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 4) + lVar20);
          local_208[0] = aVar17;
          if (vStack_220 != local_218) goto LAB_0021ddb7;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&local_228,(iterator)vStack_220,
                     (int *)local_208);
        }
        else {
          aVar17 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                    ((long)(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)
                           local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar20);
          local_208[0] = aVar17;
          if (vStack_220 == local_218) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)&local_228,(iterator)vStack_220,
                       (int *)local_208);
          }
          else {
LAB_0021ddb7:
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)vStack_220 = aVar17;
            vStack_220 = (vec<2,_float,_(glm::qualifier)0>)((long)vStack_220 + 4);
          }
        }
      }
      if (0.5 < ABS((float)local_c8._0_4_ - (float)local_1c8._0_4_)) {
        if (0.5 <= (float)local_1c8._0_4_) {
          aVar17 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                    ((long)&((pointer)
                            ((long)local_1f8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + 8))->field_0 + lVar20)
          ;
          local_208[0] = aVar17;
          if (vStack_220 != local_218) goto LAB_0021de49;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&local_228,(iterator)vStack_220,
                     (int *)local_208);
        }
        else {
          aVar17 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                    ((long)((long)local_1f8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 4) + lVar20);
          local_208[0] = aVar17;
          if (vStack_220 == local_218) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)&local_228,(iterator)vStack_220,
                       (int *)local_208);
          }
          else {
LAB_0021de49:
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)vStack_220 = aVar17;
            vStack_220 = (vec<2,_float,_(glm::qualifier)0>)((long)vStack_220 + 4);
          }
        }
      }
      uVar18 = uVar18 + 1;
      lVar20 = lVar20 + 0xc;
    } while (uVar18 < (ulong)((long)local_1f8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1f8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2) / 3);
  }
  if (vStack_220 != _local_228) {
    uVar18 = 0;
    do {
      uVar2 = *(uint *)((long)_local_228 + uVar18 * 4);
      local_208[0] = local_248.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar2].field_0;
      local_208[1] = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                      &local_248.
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar2].field_1;
      local_200 = local_248.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar2].field_2;
      local_1e0[1].x = (((pointer)((long)local_1b8 + (ulong)uVar2 * 8))->field_1).y + 0.0;
      local_1e0[0].x = (((pointer)((long)local_1b8 + (ulong)uVar2 * 8))->field_0).x + 1.0;
      if (local_248.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_248.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
        ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                  ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                    *)&local_248,
                   (iterator)
                   local_248.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (vec<3,_float,_(glm::qualifier)0> *)local_208);
      }
      else {
        pvVar1 = local_248.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar2;
        aVar17 = pvVar1->field_0;
        aVar6 = pvVar1->field_1;
        (local_248.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->field_2 = pvVar1->field_2;
        (local_248.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->field_0 = aVar17;
        (local_248.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->field_1 = aVar6;
        local_248.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_248.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if (iStack_1b0._M_current == local_1a8) {
        std::
        vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
        ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>const&>
                  ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                    *)local_1b8,iStack_1b0,(vec<2,_float,_(glm::qualifier)0> *)local_1e0);
      }
      else {
        (iStack_1b0._M_current)->field_0 = local_1e0[0];
        (iStack_1b0._M_current)->field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)local_1e0[1];
        iStack_1b0._M_current = iStack_1b0._M_current + 1;
      }
      if ((long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar20 = (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        uVar12 = 1;
        uVar15 = 2;
        uVar16 = 0;
        do {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar16;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar15;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar12;
          if ((*(uint *)((long)local_1f8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar12 * 4 + -4) == uVar2)
             && ((lVar21 = (SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU
                           ) * 3,
                 0.5 < (((pointer)
                        ((long)local_1b8 +
                        (ulong)*(uint *)((long)local_1f8.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                        uVar12 * 4 +
                                        lVar21 + (SUB168(auVar5 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2
                                                 & 0xfffffffffffffffcU) * -3) * 8))->field_0).x ||
                 (0.5 < (((pointer)
                         ((long)local_1b8 +
                         (ulong)*(uint *)((long)local_1f8.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                         uVar12 * 4 +
                                         lVar21 + (SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) *
                                                   2 & 0xfffffffffffffffcU) * -3 + 4) * 8))->field_0
                        ).x)))) {
            *(int *)((long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar12 * 4 + -4) =
                 (int)((ulong)((long)local_248.
                                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_248.
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 +
                 -1;
          }
          uVar16 = uVar16 + 1;
          lVar21 = (-(ulong)(lVar20 == 0) - lVar20) + uVar12;
          uVar12 = uVar12 + 1;
          uVar15 = uVar15 + 1;
        } while (lVar21 != 0);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ulong)((long)vStack_220 - (long)_local_228 >> 2));
  }
  this = local_68;
  Mesh::Mesh(local_68);
  Mesh::addNormals(this,&local_248);
  Mesh::addTexCoords(this,(vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                           *)local_1b8);
  if (local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar20 = 8;
    uVar18 = 0;
    do {
      *(float *)((long)local_248.
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8) =
           *(float *)((long)local_248.
                            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8) * local_b0;
      *(float *)((long)local_248.
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar20 + -4) =
           *(float *)((long)local_248.
                            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar20 + -4) * local_b0;
      *(float *)((long)&(local_248.
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar20) =
           *(float *)((long)&(local_248.
                              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar20) *
           local_b0;
      uVar18 = uVar18 + 1;
      lVar20 = lVar20 + 0xc;
    } while (uVar18 < (ulong)(((long)local_248.
                                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_248.
                                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x5555555555555555));
  }
  Mesh::addVertices(this,&local_248);
  Mesh::addIndices(this,&local_1f8);
  Mesh::computeTangents(this);
  if (_local_228 != (vec<2,_float,_(glm::qualifier)0>)0x0) {
    operator_delete((void *)_local_228);
  }
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8);
  }
  if ((pointer)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_248.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (vec<3,_float,_(glm::qualifier)0> *)0x0) {
    operator_delete(local_248.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

Mesh icosphereMesh(float _radius, size_t _iterations) {

    /// Step 1 : Generate icosahedron
    const float sqrt5 = sqrt(5.0f);
    const float phi = (1.0f + sqrt5) * 0.5f;
    const float invnorm = 1/sqrt(phi*phi+1);

    std::vector<glm::vec3> vertices;
    vertices.push_back(invnorm * glm::vec3(-1,  phi, 0));//0
    vertices.push_back(invnorm * glm::vec3( 1,  phi, 0));//1
    vertices.push_back(invnorm * glm::vec3(0,   1,  -phi));//2
    vertices.push_back(invnorm * glm::vec3(0,   1,   phi));//3
    vertices.push_back(invnorm * glm::vec3(-phi,0,  -1));//4
    vertices.push_back(invnorm * glm::vec3(-phi,0,   1));//5
    vertices.push_back(invnorm * glm::vec3( phi,0,  -1));//6
    vertices.push_back(invnorm * glm::vec3( phi,0,   1));//7
    vertices.push_back(invnorm * glm::vec3(0,   -1, -phi));//8
    vertices.push_back(invnorm * glm::vec3(0,   -1,  phi));//9
    vertices.push_back(invnorm * glm::vec3(-1,  -phi,0));//10
    vertices.push_back(invnorm * glm::vec3( 1,  -phi,0));//11
       
    std::vector<INDEX_TYPE> indices = {
        0,1,2,
        0,3,1,
        0,4,5,
        1,7,6,
        1,6,2,
        1,3,7,
        0,2,4,
        0,5,3,
        2,6,8,
        2,8,4,
        3,5,9,
        3,9,7,
        11,6,7,
        10,5,4,
        10,4,8,
        10,9,5,
        11,8,6,
        11,7,9,
        10,8,11,
        10,11,9
    };

    size_t size = indices.size();

    /// Step 2 : tessellate
    for (size_t iteration = 0; iteration < _iterations; iteration++) {
        size*=4;
        std::vector<INDEX_TYPE> newFaces;
        for (size_t i = 0; i < size/12; i++) {
            INDEX_TYPE i1 = indices[i*3];
            INDEX_TYPE i2 = indices[i*3+1];
            INDEX_TYPE i3 = indices[i*3+2];
            size_t i12 = vertices.size();
            size_t i23 = i12+1;
            size_t i13 = i12+2;
            glm::vec3 v1 = vertices[i1];
            glm::vec3 v2 = vertices[i2];
            glm::vec3 v3 = vertices[i3];
            //make 1 vertice at the center of each edge and project it onto the sphere
            vertices.push_back(glm::normalize(v1+v2));
            vertices.push_back(glm::normalize(v2+v3));
            vertices.push_back(glm::normalize(v1+v3));
            //now recreate indices
            newFaces.push_back(i1);
            newFaces.push_back(i12);
            newFaces.push_back(i13);
            newFaces.push_back(i2);
            newFaces.push_back(i23);
            newFaces.push_back(i12);
            newFaces.push_back(i3);
            newFaces.push_back(i13);
            newFaces.push_back(i23);
            newFaces.push_back(i12);
            newFaces.push_back(i23);
            newFaces.push_back(i13);
        }
        indices.swap(newFaces);
    }

    /// Step 3 : generate texcoords
    std::vector<glm::vec2> texCoords;
    for (size_t i = 0; i < vertices.size(); i++) {
        const auto& vec = vertices[i];
        float u, v;
        float r0 = sqrtf(vec.x*vec.x+vec.z*vec.z);
        float alpha;
        alpha = atan2f(vec.z,vec.x);
        u = alpha/TAU+.5f;
        v = atan2f(vec.y, r0)/PI + .5f;
        // reverse the u coord, so the default is texture mapped left to
        // right on the outside of a sphere 
        // reverse the v coord, so that texture origin is at top left
        texCoords.push_back(glm::vec2(1.0-u,1.f-v));
    }

    /// Step 4 : fix texcoords
    // find vertices to split
    std::vector<int> indexToSplit;

    for (size_t i=0; i<indices.size()/3; i++) {
        glm::vec2 t0 = texCoords[indices[i*3+0]];
        glm::vec2 t1 = texCoords[indices[i*3+1]];
        glm::vec2 t2 = texCoords[indices[i*3+2]];

        if (std::abs(t2.x-t0.x)>0.5) {
            if (t0.x<0.5)
                indexToSplit.push_back(indices[i*3]);
            else
                indexToSplit.push_back(indices[i*3+2]);
        }
        if (std::abs(t1.x-t0.x)>0.5) {
            if (t0.x<0.5)
                indexToSplit.push_back(indices[i*3]);
            else
                indexToSplit.push_back(indices[i*3+1]);
        }
        if (std::abs(t2.x-t1.x)>0.5) {
            if (t1.x<0.5)
                indexToSplit.push_back(indices[i*3+1]);
            else
                indexToSplit.push_back(indices[i*3+2]);
        }
    }

    //split vertices
    for (size_t i = 0; i < indexToSplit.size(); i++) {
        INDEX_TYPE index = indexToSplit[i];
        //duplicate vertex
        glm::vec3 v = vertices[index];
        glm::vec2 t = texCoords[index] + glm::vec2(1.f, 0.f);
        vertices.push_back(v);
        texCoords.push_back(t);
        size_t newIndex = vertices.size()-1;
        //reassign indices
        for (size_t j = 0; j<indices.size(); j++) {
            if (indices[j] == index) {
                INDEX_TYPE index1 = indices[(j+1)%3+(j/3)*3];
                INDEX_TYPE index2 = indices[(j+2)%3+(j/3)*3];
                if ((texCoords[index1].x>0.5) || (texCoords[index2].x>0.5))
                    indices[j] = newIndex;
            }
        }
    }

    Mesh mesh;
    mesh.addNormals( vertices );
    mesh.addTexCoords( texCoords );

    for (size_t i = 0; i < vertices.size(); i++ )
        vertices[i] *= _radius;

    mesh.addVertices( vertices );
    mesh.addIndices( indices );
    mesh.computeTangents();

    return  mesh;
}